

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDB_ModuleInfoStream.cpp
# Opt level: O2

Module * __thiscall PDB::ModuleInfoStream::FindLinkerModule(ModuleInfoStream *this)

{
  Module *pMVar1;
  int iVar2;
  Module *pMVar3;
  long lVar4;
  
  pMVar3 = this->m_modules + this->m_moduleCount;
  lVar4 = this->m_moduleCount + 1;
  do {
    lVar4 = lVar4 + -1;
    if (lVar4 == 0) {
      return (Module *)0x0;
    }
    pMVar1 = pMVar3 + -1;
    pMVar3 = pMVar3 + -1;
    iVar2 = strcmp(pMVar1->m_name,"* Linker *");
  } while (iVar2 != 0);
  return pMVar3;
}

Assistant:

PDB_NO_DISCARD const PDB::ModuleInfoStream::Module* PDB::ModuleInfoStream::FindLinkerModule(void) const PDB_NO_EXCEPT
{
	const size_t count = m_moduleCount;
	for (size_t i = 0u; i < count; ++i)
	{
		// with both MSVC cl.exe and Clang, the linker symbol is the last one to be stored, so start searching from the end
		const Module& module = m_modules[count - i - 1u];

		// check if this is the linker symbol
		if (std::strcmp(module.GetName().Decay(), LinkerSymbolName) == 0)
		{
			return &module;
		}
	}

	return nullptr;
}